

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::FiberPool::Impl::Impl(Impl *this,size_t stackSize)

{
  (this->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0038bdb8;
  this->stackSize = stackSize;
  this->maxFreelist = 0xffffffffffffffff;
  kj::_::Mutex::Mutex(&(this->freelist).mutex);
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->freelist).value.
  super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::_M_initialize_map
            (&(this->freelist).value.
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>,0);
  this->coreLocalFreelists = (CoreLocalFreelist *)0x0;
  return;
}

Assistant:

Impl(size_t stackSize): stackSize(stackSize) {}